

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::AppendPolygon(Clipper *this,TEdge *e1,TEdge *e2)

{
  int iVar1;
  int iVar2;
  OutRec *outRec1_00;
  OutRec *outRec2_00;
  OutPt *pOVar3;
  OutPt *pOVar4;
  OutPt *pp;
  OutPt *pOVar5;
  bool bVar6;
  reference ppOVar7;
  size_type sVar8;
  reference ppJVar9;
  reference ppHVar10;
  ulong local_80;
  size_type i_1;
  size_type i;
  TEdge *e;
  int ObsoleteIdx;
  int OKIdx;
  EdgeSide side;
  OutPt *p2_rt;
  OutPt *p2_lft;
  OutPt *p1_rt;
  OutPt *p1_lft;
  OutRec *holeStateRec;
  OutRec *outRec2;
  OutRec *outRec1;
  TEdge *e2_local;
  TEdge *e1_local;
  Clipper *this_local;
  
  ppOVar7 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                      (&this->m_PolyOuts,(long)e1->outIdx);
  outRec1_00 = *ppOVar7;
  ppOVar7 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                      (&this->m_PolyOuts,(long)e2->outIdx);
  outRec2_00 = *ppOVar7;
  bVar6 = Param1RightOfParam2(outRec1_00,outRec2_00);
  p1_lft = (OutPt *)outRec2_00;
  if ((!bVar6) &&
     (bVar6 = Param1RightOfParam2(outRec2_00,outRec1_00), p1_lft = (OutPt *)outRec1_00, !bVar6)) {
    p1_lft = (OutPt *)GetLowermostRec(outRec1_00,outRec2_00);
  }
  pOVar3 = outRec1_00->pts;
  pOVar4 = pOVar3->prev;
  pp = outRec2_00->pts;
  pOVar5 = pp->prev;
  if (e1->side == esLeft) {
    if (e2->side == esLeft) {
      ReversePolyPtLinks(pp);
      pp->next = pOVar3;
      pOVar3->prev = pp;
      pOVar4->next = pOVar5;
      pOVar5->prev = pOVar4;
      outRec1_00->pts = pOVar5;
    }
    else {
      pOVar5->next = pOVar3;
      pOVar3->prev = pOVar5;
      pp->prev = pOVar4;
      pOVar4->next = pp;
      outRec1_00->pts = pp;
    }
    ObsoleteIdx = 1;
  }
  else {
    if (e2->side == esRight) {
      ReversePolyPtLinks(pp);
      pOVar4->next = pOVar5;
      pOVar5->prev = pOVar4;
      pp->next = pOVar3;
      pOVar3->prev = pp;
    }
    else {
      pOVar4->next = pp;
      pp->prev = pOVar4;
      pOVar3->prev = pOVar5;
      pOVar5->next = pOVar3;
    }
    ObsoleteIdx = 2;
  }
  if ((OutRec *)p1_lft == outRec2_00) {
    outRec1_00->bottomPt = outRec2_00->bottomPt;
    outRec1_00->bottomPt->idx = outRec1_00->idx;
    if (outRec2_00->FirstLeft != outRec1_00) {
      outRec1_00->FirstLeft = outRec2_00->FirstLeft;
    }
    outRec1_00->isHole = (bool)(outRec2_00->isHole & 1);
  }
  outRec2_00->pts = (OutPt *)0x0;
  outRec2_00->bottomPt = (OutPt *)0x0;
  outRec2_00->AppendLink = outRec1_00;
  iVar1 = e1->outIdx;
  iVar2 = e2->outIdx;
  e1->outIdx = -1;
  e2->outIdx = -1;
  i = (size_type)this->m_ActiveEdges;
  do {
    if (i == 0) {
LAB_00adb74a:
      for (i_1 = 0; sVar8 = std::
                            vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::
                            size(&this->m_Joins), i_1 < sVar8; i_1 = i_1 + 1) {
        ppJVar9 = std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::
                  operator[](&this->m_Joins,i_1);
        if ((*ppJVar9)->poly1Idx == iVar2) {
          ppJVar9 = std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::
                    operator[](&this->m_Joins,i_1);
          (*ppJVar9)->poly1Idx = iVar1;
        }
        ppJVar9 = std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::
                  operator[](&this->m_Joins,i_1);
        if ((*ppJVar9)->poly2Idx == iVar2) {
          ppJVar9 = std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::
                    operator[](&this->m_Joins,i_1);
          (*ppJVar9)->poly2Idx = iVar1;
        }
      }
      for (local_80 = 0;
          sVar8 = std::vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                  ::size(&this->m_HorizJoins), local_80 < sVar8; local_80 = local_80 + 1) {
        ppHVar10 = std::
                   vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>::
                   operator[](&this->m_HorizJoins,local_80);
        if ((*ppHVar10)->savedIdx == iVar2) {
          ppHVar10 = std::
                     vector<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>::
                     operator[](&this->m_HorizJoins,local_80);
          (*ppHVar10)->savedIdx = iVar1;
        }
      }
      return;
    }
    if (*(int *)(i + 0x54) == iVar2) {
      *(int *)(i + 0x54) = iVar1;
      *(int *)(i + 0x44) = ObsoleteIdx;
      goto LAB_00adb74a;
    }
    i = *(size_type *)(i + 0x70);
  } while( true );
}

Assistant:

void Clipper::AppendPolygon(TEdge *e1, TEdge *e2)
{
  //get the start and ends of both output polygons ...
  OutRec *outRec1 = m_PolyOuts[e1->outIdx];
  OutRec *outRec2 = m_PolyOuts[e2->outIdx];

  OutRec *holeStateRec;
  if (Param1RightOfParam2(outRec1, outRec2)) holeStateRec = outRec2;
  else if (Param1RightOfParam2(outRec2, outRec1)) holeStateRec = outRec1;
  else holeStateRec = GetLowermostRec(outRec1, outRec2);

  OutPt* p1_lft = outRec1->pts;
  OutPt* p1_rt = p1_lft->prev;
  OutPt* p2_lft = outRec2->pts;
  OutPt* p2_rt = p2_lft->prev;

  EdgeSide side;
  //join e2 poly onto e1 poly and delete pointers to e2 ...
  if(  e1->side == esLeft )
  {
    if(  e2->side == esLeft )
    {
      //z y x a b c
      ReversePolyPtLinks(*p2_lft);
      p2_lft->next = p1_lft;
      p1_lft->prev = p2_lft;
      p1_rt->next = p2_rt;
      p2_rt->prev = p1_rt;
      outRec1->pts = p2_rt;
    } else
    {
      //x y z a b c
      p2_rt->next = p1_lft;
      p1_lft->prev = p2_rt;
      p2_lft->prev = p1_rt;
      p1_rt->next = p2_lft;
      outRec1->pts = p2_lft;
    }
    side = esLeft;
  } else
  {
    if(  e2->side == esRight )
    {
      //a b c z y x
      ReversePolyPtLinks( *p2_lft );
      p1_rt->next = p2_rt;
      p2_rt->prev = p1_rt;
      p2_lft->next = p1_lft;
      p1_lft->prev = p2_lft;
    } else
    {
      //a b c x y z
      p1_rt->next = p2_lft;
      p2_lft->prev = p1_rt;
      p1_lft->prev = p2_rt;
      p2_rt->next = p1_lft;
    }
    side = esRight;
  }

  if (holeStateRec == outRec2)
  {
    outRec1->bottomPt = outRec2->bottomPt;
    outRec1->bottomPt->idx = outRec1->idx;
    if (outRec2->FirstLeft != outRec1)
      outRec1->FirstLeft = outRec2->FirstLeft;
    outRec1->isHole = outRec2->isHole;
  }
  outRec2->pts = 0;
  outRec2->bottomPt = 0;
  outRec2->AppendLink = outRec1;
  int OKIdx = e1->outIdx;
  int ObsoleteIdx = e2->outIdx;

  e1->outIdx = -1; //nb: safe because we only get here via AddLocalMaxPoly
  e2->outIdx = -1;

  TEdge* e = m_ActiveEdges;
  while( e )
  {
    if( e->outIdx == ObsoleteIdx )
    {
      e->outIdx = OKIdx;
      e->side = side;
      break;
    }
    e = e->nextInAEL;
  }

  for (JoinList::size_type i = 0; i < m_Joins.size(); ++i)
  {
      if (m_Joins[i]->poly1Idx == ObsoleteIdx) m_Joins[i]->poly1Idx = OKIdx;
      if (m_Joins[i]->poly2Idx == ObsoleteIdx) m_Joins[i]->poly2Idx = OKIdx;
  }

  for (HorzJoinList::size_type i = 0; i < m_HorizJoins.size(); ++i)
  {
      if (m_HorizJoins[i]->savedIdx == ObsoleteIdx)
        m_HorizJoins[i]->savedIdx = OKIdx;
  }

}